

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O2

glsl_type *
array_sizing_visitor::resize_interface_members
          (glsl_type *type,int *max_ifc_array_access,bool is_ssbo)

{
  uint num_fields;
  size_t sVar1;
  byte bVar2;
  glsl_struct_field *pgVar3;
  glsl_type *pgVar4;
  glsl_struct_field *type_00;
  uint i;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  bool implicit_sized_array;
  bool local_49;
  glsl_struct_field *local_48;
  size_t local_40;
  glsl_type *local_38;
  
  num_fields = type->length;
  uVar6 = (ulong)num_fields;
  local_40 = uVar6 * 0x30;
  pgVar3 = (glsl_struct_field *)operator_new__(local_40);
  type_00 = pgVar3;
  sVar7 = local_40;
  sVar1 = uVar6;
  while (local_48 = type_00, sVar1 != 0) {
    glsl_struct_field::glsl_struct_field(pgVar3);
    pgVar3 = pgVar3 + 1;
    sVar7 = sVar7 - 0x30;
    type_00 = local_48;
    sVar1 = sVar7;
  }
  local_38 = type;
  memcpy(type_00,(type->fields).array,local_40);
  for (uVar5 = 0; pgVar3 = local_48, uVar6 != uVar5; uVar5 = uVar5 + 1) {
    bVar2 = type_00->field_0x28;
    local_49 = (bool)(bVar2 >> 1 & 1);
    if (num_fields - 1 != uVar5 || !is_ssbo) {
      fixup_type(&type_00->type,max_ifc_array_access[uVar5],false,&local_49);
      bVar2 = type_00->field_0x28;
    }
    type_00->field_0x28 = bVar2 & 0xfd | local_49 * '\x02';
    type_00 = type_00 + 1;
  }
  pgVar4 = glsl_type::get_interface_instance
                     (local_48,num_fields,
                      *(uint *)&local_38->field_0x4 >> 0x16 & GLSL_INTERFACE_PACKING_STD430,
                      (bool)((byte)(*(uint *)&local_38->field_0x4 >> 0x18) & 1),local_38->name);
  operator_delete__(pgVar3);
  return pgVar4;
}

Assistant:

static const glsl_type *
   resize_interface_members(const glsl_type *type,
                            const int *max_ifc_array_access,
                            bool is_ssbo)
   {
      unsigned num_fields = type->length;
      glsl_struct_field *fields = new glsl_struct_field[num_fields];
      memcpy(fields, type->fields.structure,
             num_fields * sizeof(*fields));
      for (unsigned i = 0; i < num_fields; i++) {
         bool implicit_sized_array = fields[i].implicit_sized_array;
         /* If SSBO last member is unsized array, we don't replace it by a sized
          * array.
          */
         if (is_ssbo && i == (num_fields - 1))
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       true, &implicit_sized_array);
         else
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       false, &implicit_sized_array);
         fields[i].implicit_sized_array = implicit_sized_array;
      }
      glsl_interface_packing packing =
         (glsl_interface_packing) type->interface_packing;
      bool row_major = (bool) type->interface_row_major;
      const glsl_type *new_ifc_type =
         glsl_type::get_interface_instance(fields, num_fields,
                                           packing, row_major, type->name);
      delete [] fields;
      return new_ifc_type;
   }